

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O1

void __thiscall amrex::ClusterList::ClusterList(ClusterList *this,IntVect *pts,Long len)

{
  size_t *psVar1;
  Cluster *this_00;
  _List_node_base *p_Var2;
  
  (this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl._M_node.
  _M_size = 0;
  this_00 = (Cluster *)operator_new(0x30);
  (this_00->m_bx).smallend.vect[0] = 1;
  (this_00->m_bx).smallend.vect[1] = 1;
  (this_00->m_bx).smallend.vect[2] = 1;
  (this_00->m_bx).bigend.vect[0] = 0;
  (this_00->m_bx).bigend.vect[1] = 0;
  *(undefined8 *)((this_00->m_bx).bigend.vect + 2) = 0;
  this_00->m_ar = pts;
  this_00->m_len = len;
  Cluster::minBox(this_00);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

ClusterList::ClusterList (IntVect* pts, Long len)
{
    lst.push_back(new Cluster(pts,len));
}